

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

void Extra_Permutations_rec(char **pRes,int nFact,int n,char *Array)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  int nFact_00;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  char **ppcVar7;
  
  if (n == 1) {
    **pRes = *Array;
  }
  else if (0 < n) {
    uVar5 = (ulong)(n - 1U);
    nFact_00 = (int)((long)nFact / (long)n);
    lVar4 = (long)nFact_00;
    cVar2 = Array[uVar5];
    ppcVar7 = pRes + lVar4 * uVar5;
    uVar6 = 0;
    do {
      cVar1 = Array[uVar6];
      Array[uVar6] = cVar2;
      Array[uVar5] = cVar1;
      if (0 < nFact_00) {
        uVar3 = 0;
        do {
          ppcVar7[uVar3][uVar5] = cVar1;
          uVar3 = uVar3 + 1;
        } while (((long)nFact / (long)n & 0xffffffffU) != uVar3);
      }
      Extra_Permutations_rec(pRes + (uVar5 - uVar6) * lVar4,nFact_00,n - 1U,Array);
      cVar2 = Array[uVar6];
      Array[uVar6] = Array[uVar5];
      Array[uVar5] = cVar2;
      uVar6 = uVar6 + 1;
      ppcVar7 = ppcVar7 + -lVar4;
    } while (uVar6 != (uint)n);
  }
  return;
}

Assistant:

void Extra_Permutations_rec( char ** pRes, int nFact, int n, char Array[] )
{
    char ** pNext;
    int nFactNext;
    int iTemp, iCur, iLast, k;

    if ( n == 1 )
    {
        pRes[0][0] = Array[0];
        return;
    }

    // get the next factorial
    nFactNext = nFact / n;
    // get the last entry
    iLast = n - 1;

    for ( iCur = 0; iCur < n; iCur++ )
    {
        // swap Cur and Last
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;

        // get the pointer to the current section
        pNext = pRes + (n - 1 - iCur) * nFactNext;

        // set the last entry 
        for ( k = 0; k < nFactNext; k++ )
            pNext[k][iLast] = Array[iLast];

        // call recursively for this part
        Extra_Permutations_rec( pNext, nFactNext, n - 1, Array );

        // swap them back
        iTemp        = Array[iCur];
        Array[iCur]  = Array[iLast];
        Array[iLast] = iTemp;
    }
}